

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact.hpp
# Opt level: O3

vector<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
* __thiscall
njoy::ENDFtk::section::Type<32,_151>::CompactCorrelationMatrix::compact
          (vector<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
           *__return_storage_ptr__,CompactCorrelationMatrix *this)

{
  double *pdVar1;
  pointer puVar2;
  long lVar3;
  iterator __position;
  int iVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  pointer puVar8;
  pointer ptVar9;
  long lVar10;
  double dVar11;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  allocator_type local_9d;
  int local_9c;
  vector<int,_std::allocator<int>_> local_98;
  tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_> local_78;
  ulong local_50;
  double local_48;
  ulong local_40;
  long local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar1 = (this->correlations_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->correlations_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    uVar7 = this->ndigit_ - 2;
    local_9c = 0;
    local_50 = 0;
    local_48 = 1.0;
    if (uVar7 < 5) {
      local_50 = (ulong)*(uint *)(&DAT_001a37c0 + (ulong)uVar7 * 4);
      local_48 = *(double *)(&DAT_001a37d8 + (ulong)uVar7 * 8);
    }
    puVar2 = (this->i_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar8 = (this->j_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar11 = *pdVar1 * local_48;
    if (1.0 < ABS(dVar11)) {
      if (dVar11 <= 0.0) {
        dVar11 = floor(ABS(dVar11));
        dVar11 = -dVar11;
      }
      else {
        dVar11 = floor(dVar11);
      }
      local_9c = (int)dVar11;
    }
    __l._M_len = 1;
    __l._M_array = &local_9c;
    std::vector<int,_std::allocator<int>_>::vector(&local_98,__l,&local_9d);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_78,&local_98);
    local_78.
    super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
    super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
    super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = *puVar8;
    local_78.
    super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
    super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>._28_4_ = *puVar2;
    std::
    vector<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>,std::allocator<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>>>
    ::emplace_back<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>>
              ((vector<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>,std::allocator<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>>>
                *)__return_storage_ptr__,&local_78);
    if (local_78.
        super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
        super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
        super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
        super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
        (pointer)0x0) {
      operator_delete(local_78.
                      super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                      .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                      .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                      super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                      _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                            .
                            super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                            .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                            super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                            _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                            .
                            super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                            .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                            super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                            _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar5 = (long)(this->i_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(this->i_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if ((uVar5 & 0x3fffffff8) != 0) {
      local_40 = local_50 & 0xffffffff;
      local_38 = (uVar5 >> 2 & 0xffffffff) - 1;
      lVar10 = 0;
      do {
        puVar2 = (this->i_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        ptVar9 = (__return_storage_ptr__->
                 super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (puVar2[lVar10 + 1] ==
            *(uint *)&ptVar9[-1].
                      super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                      .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                      .field_0x1c) {
          lVar3 = *(long *)&ptVar9[-1].
                            super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                            .
                            super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                            .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                            super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                            _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl;
          lVar6 = (long)*(pointer *)
                         ((long)&ptVar9[-1].
                                 super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                                 .
                                 super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                                 .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                                 super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>
                                 ._M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl
                         + 8) - lVar3;
          uVar5 = lVar6 >> 2;
          puVar8 = (this->j_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (local_40 <= uVar5) goto LAB_00134b5f;
          uVar7 = ptVar9[-1].
                  super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                  .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
                  super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
          if ((int)local_50 + uVar7 <= puVar8[lVar10 + 1]) {
            dVar11 = (this->correlations_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar10 + 1] * local_48;
            iVar4 = 0;
            if (1.0 < ABS(dVar11)) {
              if (dVar11 <= 0.0) {
                dVar11 = floor(ABS(dVar11));
                dVar11 = -dVar11;
              }
              else {
                dVar11 = floor(dVar11);
              }
              iVar4 = (int)dVar11;
            }
            __l_01._M_len = 1;
            __l_01._M_array = &local_9c;
            local_9c = iVar4;
            std::vector<int,_std::allocator<int>_>::vector(&local_98,__l_01,&local_9d);
            local_78.
            super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
            .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
            super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
            super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
                 local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_78.
            super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
            .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
            super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
            super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
                 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
            local_78.
            super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
            .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
            super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
            super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage =
                 local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            local_78.
            super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
            .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
            super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = puVar8[lVar10 + 1];
            local_78.
            super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
            .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>._28_4_ =
                 puVar2[lVar10 + 1];
            std::
            vector<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>,std::allocator<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>>>
            ::
            emplace_back<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>>
                      ((vector<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>,std::allocator<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>>>
                        *)__return_storage_ptr__,&local_78);
            goto LAB_00134c17;
          }
          uVar7 = puVar8[lVar10 + 1] - (uVar7 + (int)uVar5);
          if (0 < (int)uVar7) {
            local_78.
            super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
            .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
            super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
            super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((ulong)local_78.
                                  super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                                  .
                                  super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                                  .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                                  super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>
                                  ._M_head_impl.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
            std::vector<int,_std::allocator<int>_>::_M_fill_insert
                      ((vector<int,_std::allocator<int>_> *)(ptVar9 + -1),(int *)(lVar3 + lVar6),
                       (ulong)uVar7,(value_type_conflict3 *)&local_78);
            ptVar9 = (__return_storage_ptr__->
                     super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          }
          dVar11 = (this->correlations_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start[lVar10 + 1] * local_48;
          iVar4 = 0;
          if (1.0 < ABS(dVar11)) {
            if (dVar11 <= 0.0) {
              dVar11 = floor(ABS(dVar11));
              dVar11 = -dVar11;
            }
            else {
              dVar11 = floor(dVar11);
            }
            iVar4 = (int)dVar11;
          }
          local_78.
          super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
          .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
          super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
          super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_78.
                                 super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                                 .
                                 super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                                 .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                                 super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>
                                 ._M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data._M_start._4_4_,iVar4);
          __position._M_current =
               *(pointer *)
                ((long)&ptVar9[-1].
                        super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                        .
                        super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                        .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                        super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                        _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
          if (__position._M_current ==
              *(pointer *)
               ((long)&ptVar9[-1].
                       super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                       .
                       super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                       .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                       super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                       _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl + 0x10)) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)(ptVar9 + -1),__position,
                       (int *)&local_78);
          }
          else {
            *__position._M_current = iVar4;
            *(int **)((long)&ptVar9[-1].
                             super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                             .
                             super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                             .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                             super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                             _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)
                 = __position._M_current + 1;
          }
        }
        else {
          puVar8 = (this->j_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
LAB_00134b5f:
          dVar11 = (this->correlations_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start[lVar10 + 1] * local_48;
          iVar4 = 0;
          if (1.0 < ABS(dVar11)) {
            if (dVar11 <= 0.0) {
              dVar11 = floor(ABS(dVar11));
              dVar11 = -dVar11;
            }
            else {
              dVar11 = floor(dVar11);
            }
            iVar4 = (int)dVar11;
          }
          __l_00._M_len = 1;
          __l_00._M_array = &local_9c;
          local_9c = iVar4;
          std::vector<int,_std::allocator<int>_>::vector(&local_98,__l_00,&local_9d);
          local_78.
          super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
          .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
          super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
          super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
               local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_78.
          super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
          .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
          super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
          super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
               local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_78.
          super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
          .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
          super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
          super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage =
               local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_78.
          super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
          .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
          super__Head_base<1UL,_unsigned_int,_false>._M_head_impl = puVar8[lVar10 + 1];
          local_78.
          super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
          .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>._28_4_ =
               puVar2[lVar10 + 1];
          std::
          vector<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>,std::allocator<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>>>
          ::emplace_back<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>>
                    ((vector<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>,std::allocator<std::tuple<unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>>>>
                      *)__return_storage_ptr__,&local_78);
LAB_00134c17:
          if (local_78.
              super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
              .super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>.
              super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
              super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              != (pointer)0x0) {
            operator_delete(local_78.
                            super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                            .
                            super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                            .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                            super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                            _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_78.
                                  super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                                  .
                                  super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                                  .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                                  super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>
                                  ._M_head_impl.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.
                                  super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                                  .
                                  super__Tuple_impl<1UL,_unsigned_int,_std::vector<int,_std::allocator<int>_>_>
                                  .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                                  super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>
                                  ._M_head_impl.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
        lVar10 = lVar10 + 1;
      } while (local_38 != lVar10);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector< std::tuple< unsigned int, unsigned int,
                         std::vector< int > > > compact() const {

  // this code is not pretty, but the INTG records are just dumb so ...

  std::vector< std::tuple< unsigned int, unsigned int,
                           std::vector< int > > > lines;
  if ( this->correlations_.size() != 0 ) {

    // the maximum number of values per line
    unsigned int n = 0;
    switch ( this->NDIGIT() ) {

      case 2: { n = 18; break; }
      case 3: { n = 13; break; }
      case 4: { n = 11; break; }
      case 5: { n =  9; break; }
      case 6: { n =  8; break; }
      default: { /* unreachable */ break; }
    }

    // conversion factor
    double factor = 1;
    switch ( this->NDIGIT() ) {

      case 2: { factor = 100; break; }
      case 3: { factor = 1000; break; }
      case 4: { factor = 10000; break; }
      case 5: { factor = 100000; break; }
      case 6: { factor = 1000000; break; }
      default: { /* unreachable */ break; }
    }

    // conversion function
    auto convert = [factor] ( double value ) -> int {

      value *= factor;
      if ( std::abs( value ) <= 1. ) {

        return 0;
      }
      if ( value > 0. ) {

        return std::floor( value );
      }
      else {

        return -std::floor( std::abs( value ) );
      }
    };

    // compact the correlation matrix
    lines.push_back( { this->i_[0], this->j_[0], { convert( this->correlations_[0] ) } } );
    unsigned int size = this->i_.size();
    for ( unsigned int i = 1; i < size; ++i ) {

      if ( ( this->i_[i] == std::get< 0 >( lines.back() ) ) &&
           ( std::get< 2 >( lines.back() ) ).size() < n ) {

        if ( this->j_[i] < std::get< 1 >( lines.back() ) + n ) {

          int pad = this->j_[i] - std::get< 1 >( lines.back() ) - std::get< 2 >( lines.back() ).size();
          if ( pad > 0 ) {

            std::get< 2 >( lines.back() ).insert( std::get< 2 >( lines.back() ).end(),
                                                  pad,
                                                  0 );
          }
          std::get< 2 >( lines.back() ).emplace_back( convert( this->correlations_[i] ) );
        }
        else {

          lines.emplace_back( std::make_tuple (
                                this->i_[i],
                                this->j_[i],
                                std::vector< int >{ convert( this->correlations_[i] ) } ) );
        }
      }
      else {

        lines.emplace_back( std::make_tuple (
                              this->i_[i],
                              this->j_[i],
                              std::vector< int >{ convert( this->correlations_[i] ) } ) );
      }
    }
  }

  return lines;
}